

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trapezoidal_decomposition.cc
# Opt level: O2

void __thiscall PolygonTriangulation::init_permutation_table(PolygonTriangulation *this)

{
  pointer puVar1;
  int iVar2;
  uint uVar3;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->permutation_,(ulong)this->num_segments_);
  uVar3 = 0;
  iVar2 = -1;
  while( true ) {
    puVar1 = (this->permutation_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->permutation_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1 >> 2) <= (ulong)uVar3) break;
    puVar1[uVar3] = this->num_segments_ + iVar2;
    uVar3 = uVar3 + 1;
    iVar2 = iVar2 + -1;
  }
  return;
}

Assistant:

void PolygonTriangulation::init_permutation_table()
{
  permutation_.resize(num_segments_);
  for (auto i = 0u; i < permutation_.size(); ++i) {
    permutation_[i] = num_segments_-i-1;
  }
#if 0
  const auto seed = std::chrono::system_clock::now().time_since_epoch().count();
  fprintf(stderr, "seed used : %lu\n", seed);
  std::shuffle(permutation_.begin(), permutation_.end(), std::default_random_engine(seed));
#endif
}